

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_line_progressed(Parser *this,size_t ahead)

{
  State *pSVar1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  basic_substring<const_char> *pbVar8;
  char msg [74];
  basic_substring<const_char> local_68 [4];
  undefined2 local_20;
  
  pSVar1 = this->m_state;
  (pSVar1->pos).super_LineCol.offset = (pSVar1->pos).super_LineCol.offset + ahead;
  uVar5 = (pSVar1->pos).super_LineCol.col + ahead;
  (pSVar1->pos).super_LineCol.col = uVar5;
  if ((pSVar1->line_contents).stripped.len + 1 < uVar5) {
    pcVar7 = "check failed: (m_state->pos.col <= m_state->line_contents.stripped.len+1)";
    pbVar8 = local_68;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      pbVar8->str = *(char **)pcVar7;
      pcVar7 = pcVar7 + 8;
      pbVar8 = (basic_substring<const_char> *)&pbVar8->len;
    }
    local_20 = 0x29;
    if ((s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x769f) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x769f) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)local_68,0x4a,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  pSVar1 = this->m_state;
  if (ahead <= (pSVar1->line_contents).rem.len) {
    basic_substring<const_char>::basic_substring
              (local_68,(pSVar1->line_contents).rem.str + ahead,
               (pSVar1->line_contents).rem.len - ahead);
    (pSVar1->line_contents).rem.str = local_68[0].str;
    (pSVar1->line_contents).rem.len = local_68[0].len;
    return;
  }
  if ((s_error_flags & 1) != 0) {
    bVar4 = is_debugger_attached();
    if (bVar4) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
  }
  handle_error(0x250c0a,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1533,"first >= 0 && first <= len");
}

Assistant:

void Parser::_line_progressed(size_t ahead)
{
    _c4dbgpf("line[{}] ({} cols) progressed by {}:  col {}-->{}   offset {}-->{}", m_state->pos.line, m_state->line_contents.full.len, ahead, m_state->pos.col, m_state->pos.col+ahead, m_state->pos.offset, m_state->pos.offset+ahead);
    m_state->pos.offset += ahead;
    m_state->pos.col += ahead;
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.col <= m_state->line_contents.stripped.len+1);
    m_state->line_contents.rem = m_state->line_contents.rem.sub(ahead);
}